

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsteps.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  int iVar2;
  long in_RSI;
  int in_EDI;
  int j;
  int n;
  char *a;
  int i;
  int local_28;
  int local_14;
  int local_4;
  
  if (in_EDI < 3) {
    printf(
          "Generate steps:\n\n a2->      +-------+\n           |       |\n a1-> -----+       |\n a3->              +----\n      <-n1-><--n2-><-n3>\n\ngiven in command lines as: a1 n1 a2 n2 a3 n3\n"
          );
    local_4 = 1;
  }
  else {
    for (local_14 = 1; local_14 + 1 < in_EDI; local_14 = local_14 + 2) {
      uVar1 = *(undefined8 *)(in_RSI + (long)local_14 * 8);
      iVar2 = atoi(*(char **)(in_RSI + (long)(local_14 + 1) * 8));
      for (local_28 = 0; local_28 < iVar2; local_28 = local_28 + 1) {
        printf("%s\n",uVar1);
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main (int argc, char* argv[])
{
    if(argc < 3) {
	printf("Generate steps:\n"\
	       "\n"\
	       " a2->      +-------+\n"\
	       "           |       |\n"\
	       " a1-> -----+       |\n"\
	       " a3->              +----\n"\
	       "      <-n1-><--n2-><-n3>\n"\
	       "\n"\
	       "given in command lines as: a1 n1 a2 n2 a3 n3\n");
	return 1;
    }
    for(int i = 1; i+1 < argc; i += 2) {
	char	*a = argv[i];
	int	n = atoi(argv[i+1]);
	for(int j = 0; j < n; ++j) {
	    printf("%s\n", a);
	}
    }
    return 0;
}